

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

size_t confidential_value_varint_from_bytes(uchar *bytes,uint64_t *v)

{
  long lVar1;
  size_t sVar2;
  uint64_t uVar3;
  
  if ((byte)(*bytes - 1) < 0xb) {
    lVar1 = (ulong)(byte)(*bytes - 1) * 8;
    uVar3 = *(uint64_t *)(&DAT_006157e0 + lVar1);
    sVar2 = *(size_t *)(&DAT_00615838 + lVar1);
  }
  else {
    sVar2 = 1;
    uVar3 = 0;
  }
  *v = uVar3;
  return sVar2;
}

Assistant:

size_t varint_from_bytes(const unsigned char *bytes, uint64_t *v)
{
#define b(n) ((uint64_t)bytes[n] << ((n - 1) * 8))
    switch (*bytes) {
    case VI_TAG_16:
        *v = b(2) | b(1);
        return sizeof(uint8_t) + sizeof(uint16_t);
    case VI_TAG_32:
        *v = b(4) | b(3) | b(2) | b(1);
        return sizeof(uint8_t) + sizeof(uint32_t);
    case VI_TAG_64:
        *v = b(8) | b(7) | b(6) | b(5) | b(4) | b(3) | b(2) | b(1);
        return sizeof(uint8_t) + sizeof(uint64_t);
    }
    *v = *bytes;
    return sizeof(uint8_t);
#undef b
}